

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

void validate_primal_solution
               (Instance *instance,Solution *solution,int32_t min_num_customers_served)

{
  Tour *tour;
  uint uVar1;
  int iVar2;
  uint i;
  long lVar3;
  ulong uVar4;
  double best_integer;
  double dVar5;
  double dVar6;
  double local_48;
  double dStack_40;
  double local_38;
  
  tour = &solution->tour;
  validate_tour(instance,tour,min_num_customers_served);
  dVar5 = solution->primal_bound;
  dVar6 = (dVar5 - solution->dual_bound) / (ABS(dVar5) + 1e-10);
  if ((dVar6 <= 0.0) && (1e-06 < ABS(dVar6))) {
    __assert_fail("fgte(gap, 0.0, 1e-6)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                  ,0x34,"void validate_primal_solution(const Instance *, Solution *, int32_t)");
  }
  dVar6 = INFINITY;
  if ((solution->tour).num_comps != 1) {
LAB_0010860a:
    if (ABS(dVar6 - dVar5) <= 1e-05) {
      return;
    }
    __assert_fail("feq(obj, solution->primal_bound, 1e-5)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                  ,0x39,"void validate_primal_solution(const Instance *, Solution *, int32_t)");
  }
  uVar1 = tour->num_customers;
  if (-1 < (int)uVar1) {
    lVar3 = 0;
    do {
      iVar2 = (solution->tour).succ[lVar3];
      if ((-1 < iVar2) && (((int)uVar1 < iVar2 || ((solution->tour).comp[lVar3] != 0))))
      goto LAB_0010860a;
      lVar3 = lVar3 + 1;
    } while ((ulong)uVar1 + 1 != lVar3);
    local_48 = *instance->demands + 0.0;
    dStack_40 = *instance->profits + 0.0;
    local_38 = 0.0;
    uVar4 = 0;
    do {
      i = (uint)uVar4;
      uVar1 = (solution->tour).succ[uVar4];
      lVar3 = (long)(int)uVar1;
      if (lVar3 == 0) {
        dVar5 = cptp_dist(instance,i,0);
        uVar4 = -(ulong)(instance->vehicle_cap < local_48);
        dVar6 = (double)(uVar4 & 0x7ff0000000000000 |
                        ~uVar4 & (ulong)((local_38 + dVar5) - dStack_40));
        dVar5 = solution->primal_bound;
        goto LAB_0010860a;
      }
      if (uVar1 == i) {
        __assert_fail("next_vertex != curr_vertex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                      ,0x80,"double tour_eval(const Instance *, Tour *)");
      }
      dVar5 = cptp_dist(instance,i,uVar1);
      if ((int)uVar1 < 0) break;
      local_38 = local_38 + dVar5;
      local_48 = local_48 + instance->demands[lVar3];
      dStack_40 = dStack_40 + instance->profits[lVar3];
      uVar4 = (ulong)uVar1;
    } while ((int)uVar1 <= tour->num_customers);
  }
  __assert_fail("idx >= 0 && idx < len",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/types.h"
                ,0x6c,"int32_t *veci32_access(int32_t *, int32_t, int32_t)");
}

Assistant:

void validate_primal_solution(const Instance *instance, Solution *solution,
                              int32_t min_num_customers_served) {
#ifndef NDEBUG

    validate_tour(instance, &solution->tour, min_num_customers_served);

    // Upper bound should be bigger than lower bound
    double gap = solution_relgap(solution);
    assert(fgte(gap, 0.0, 1e-6));

    // The recomputed objective value should be the same of what is stored
    // inside the solution
    double obj = tour_eval(instance, &solution->tour);
    assert(feq(obj, solution->primal_bound, 1e-5));

#else
    UNUSED_PARAM(instance);
    UNUSED_PARAM(solution);
    UNUSED_PARAM(min_num_customers_served);
#endif
}